

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_set_int(secp256k1_fe *r,int a)

{
  int a_local;
  secp256k1_fe *r_local;
  
  r->n[0] = (long)a;
  r->n[4] = 0;
  r->n[3] = 0;
  r->n[2] = 0;
  r->n[1] = 0;
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_set_int(secp256k1_fe *r, int a) {
    VERIFY_CHECK(0 <= a && a <= 0x7FFF);
    r->n[0] = a;
    r->n[1] = r->n[2] = r->n[3] = r->n[4] = 0;
#ifdef VERIFY
    r->magnitude = (a != 0);
    r->normalized = 1;
    secp256k1_fe_verify(r);
#endif
}